

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall
clickhouse::ColumnVector<absl::int128>::Append(ColumnVector<absl::int128> *this,ColumnRef *column)

{
  shared_ptr<clickhouse::ColumnVector<absl::int128>_> col;
  _func_int **local_20;
  
  Column::As<clickhouse::ColumnVector<absl::int128>>((Column *)&stack0xffffffffffffffe0);
  if (local_20 != (_func_int **)0x0) {
    std::vector<absl::int128,std::allocator<absl::int128>>::
    insert<__gnu_cxx::__normal_iterator<absl::int128*,std::vector<absl::int128,std::allocator<absl::int128>>>,void>
              ((vector<absl::int128,std::allocator<absl::int128>> *)&this->data_,
               (this->data_).super__Vector_base<absl::int128,_std::allocator<absl::int128>_>._M_impl
               .super__Vector_impl_data._M_finish,(int128 *)local_20[5],(int128 *)local_20[6]);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void ColumnVector<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnVector<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}